

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignOperator.cpp
# Opt level: O2

void __thiscall lts2::SignOperator::Apply(SignOperator *this,Mat *X,Mat *Ax)

{
  float fVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long *plVar5;
  long lVar6;
  long *plVar7;
  long lVar8;
  long lVar9;
  undefined8 uVar10;
  long lVar11;
  int y;
  long lVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  allocator local_39;
  undefined8 local_38;
  string local_30 [32];
  
  if (((*(uint *)X & 0xfff) == 5) && (*(long *)(X + 0x10) != 0)) {
    local_38 = CONCAT44((int)**(undefined8 **)(X + 0x40),
                        (int)((ulong)**(undefined8 **)(X + 0x40) >> 0x20));
    cv::Mat::create(Ax,&local_38,5);
    iVar2 = *(int *)(Ax + 8);
    lVar4 = *(long *)(X + 0x10);
    plVar5 = *(long **)(X + 0x48);
    lVar6 = *(long *)(Ax + 0x10);
    plVar7 = *(long **)(Ax + 0x48);
    iVar3 = *(int *)(Ax + 0xc);
    for (lVar12 = 0; lVar12 < iVar2; lVar12 = lVar12 + 1) {
      lVar8 = *plVar5;
      lVar9 = *plVar7;
      for (lVar11 = 0; (int)lVar11 < iVar3; lVar11 = lVar11 + 1) {
        fVar1 = *(float *)(lVar8 * lVar12 + lVar4 + lVar11 * 4);
        uVar13 = 0xbf800000;
        if (-1e-06 <= fVar1) {
          uVar13 = 0;
        }
        uVar14 = 0x3f800000;
        if (fVar1 <= 1e-06) {
          uVar14 = uVar13;
        }
        *(undefined4 *)(lVar9 * lVar12 + lVar6 + lVar11 * 4) = uVar14;
      }
    }
    return;
  }
  std::__cxx11::string::string(local_30,"X.type() == CV_32F && X.data",&local_39);
  uVar10 = cv::error(-0xd7,local_30,"Apply",
                     "/workspace/llm4binary/github/license_c_cmakelists/sansuiso[P]LBDReconstruction/src/LBDReconstruction/SignOperator.cpp"
                     ,0x2f);
  std::__cxx11::string::~string(local_30);
  _Unwind_Resume(uVar10);
}

Assistant:

void lts2::SignOperator::Apply(cv::Mat const &X, cv::Mat &Ax)
{
  CV_Assert(X.type() == CV_32F && X.data);

  Ax.create(X.size(), X.type());

#ifdef WITH_DISPATCH
  dispatch_queue_t queue = dispatch_get_global_queue(DISPATCH_QUEUE_PRIORITY_HIGH, 0);
  dispatch_apply(Ax.rows, queue,
                 ^(size_t y) {
                   float const *p_x = X.ptr<float>(y);
                   float *p_ax = Ax.ptr<float>(y);

                   for (int x = 0; x < Ax.cols; ++x, ++p_x, ++p_ax)
                   {
                     if (*p_x > MY_EPSILON) *p_ax = 1.0;
                     else if (*p_x < -MY_EPSILON) *p_ax = -1.0;
                     else *p_ax = 0.0;
                   }
                 });
#else
  for (int y = 0; y < Ax.rows; ++y)
  {
    float const *p_x = X.ptr<float>(y);
    float *p_ax = Ax.ptr<float>(y);

    for (int x = 0; x < Ax.cols; ++x, ++p_x, ++p_ax)
    {
      if (*p_x > MY_EPSILON) *p_ax = 1.0;
      else if (*p_x < -MY_EPSILON) *p_ax = -1.0;
      else *p_ax = 0.0;
    }
  }
#endif
}